

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
          (SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> *this,Base *other)

{
  (this->super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>).firstElement;
  (this->super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>).len = 0;
  (this->super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>).cap = 2;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
  append<const_slang::IntervalMapDetails::Path::Entry_*>
            (&this->super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>,other->data_,
             other->data_ + other->len);
  return;
}

Assistant:

SmallVector(const Base& other) : Base(N) { this->append(other.begin(), other.end()); }